

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O2

Integer pnga_sprs_array_create_from_dense(Integer g_a,Integer idx_size,Integer trans)

{
  float fVar1;
  Integer s_a;
  logical lVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  Integer lo [2];
  Integer hi [2];
  int _val;
  float fStack_74;
  double dStack_70;
  void *vptr;
  void *local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  Integer ld;
  
  lVar11 = g_a + 1000;
  lVar8 = (long)GA[lVar11].p_handle;
  local_60 = (void *)pnga_pgroup_nodeid(lVar8);
  iVar10 = GA[lVar11].type;
  local_50 = (long)_ga_sync_begin;
  local_48 = (long)_ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (local_50 != 0) {
    pnga_pgroup_sync(lVar8);
  }
  local_40 = lVar8;
  if (GA[lVar11].ndim != 2) {
    pnga_error("(ga_sprs_array_create_from_dense) global array must be of dimension 2",0);
  }
  s_a = pnga_sprs_array_create
                  (GA[lVar11].dims[trans != 0],GA[lVar11].dims[trans == 0],(long)iVar10,idx_size);
  pnga_distribution(g_a,(long)(int)local_60,lo,hi);
  pnga_access_ptr(g_a,lo,hi,&vptr,&ld);
  if (idx_size == 4) {
    iVar3 = (int)hi[0];
    switch(iVar10 + -0x3e9) {
    case 0:
      local_60 = (void *)((ulong)((iVar3 - (int)lo[0]) + 1) << 0x20);
      lVar8 = hi[0];
      for (lVar11 = CONCAT44(lo[1]._4_4_,(int)lo[1]); lVar11 <= hi[1]; lVar11 = lVar11 + 1) {
        lVar9 = CONCAT44(lo[0]._4_4_,(int)lo[0]);
        lVar12 = (lVar9 << 0x20) + (lVar11 - CONCAT44(lo[1]._4_4_,(int)lo[1])) * (long)local_60;
        for (; lVar9 <= lVar8; lVar9 = lVar9 + 1) {
          iVar10 = *(int *)((long)vptr +
                           (CONCAT44(lo[0]._4_4_,(int)lo[0]) * -0x100000000 + lVar12 >> 0x1e));
          __val = (double)CONCAT44(fStack_74,iVar10);
          if ((lVar11 == lVar9) || (iVar10 != 0)) {
            lVar6 = lVar11;
            lVar8 = lVar9;
            if (trans == 0) {
              lVar6 = lVar9;
              lVar8 = lVar11;
            }
            pnga_sprs_array_add_element(s_a,lVar6 + -1,lVar8 + -1,&_val);
            lVar8 = hi[0];
          }
          lVar12 = lVar12 + 0x100000000;
        }
      }
      break;
    case 1:
      local_60 = (void *)((ulong)((iVar3 - (int)lo[0]) + 1) << 0x20);
      lVar8 = hi[0];
      for (lVar11 = CONCAT44(lo[1]._4_4_,(int)lo[1]); lVar11 <= hi[1]; lVar11 = lVar11 + 1) {
        lVar9 = CONCAT44(lo[0]._4_4_,(int)lo[0]);
        lVar12 = (lVar9 << 0x20) + (lVar11 - CONCAT44(lo[1]._4_4_,(int)lo[1])) * (long)local_60;
        for (; lVar9 <= lVar8; lVar9 = lVar9 + 1) {
          __val = *(double *)
                   ((long)vptr + (CONCAT44(lo[0]._4_4_,(int)lo[0]) * -0x100000000 + lVar12 >> 0x1d))
          ;
          if ((lVar11 == lVar9) || (__val != 0.0)) {
            lVar6 = lVar11;
            lVar8 = lVar9;
            if (trans == 0) {
              lVar6 = lVar9;
              lVar8 = lVar11;
            }
            pnga_sprs_array_add_element(s_a,lVar6 + -1,lVar8 + -1,&_val);
            lVar8 = hi[0];
          }
          lVar12 = lVar12 + 0x100000000;
        }
      }
      break;
    case 2:
      local_60 = (void *)((ulong)((iVar3 - (int)lo[0]) + 1) << 0x20);
      lVar8 = hi[0];
      for (lVar11 = CONCAT44(lo[1]._4_4_,(int)lo[1]); lVar11 <= hi[1]; lVar11 = lVar11 + 1) {
        lVar9 = CONCAT44(lo[0]._4_4_,(int)lo[0]);
        lVar12 = (lVar9 << 0x20) + (lVar11 - CONCAT44(lo[1]._4_4_,(int)lo[1])) * (long)local_60;
        for (; lVar9 <= lVar8; lVar9 = lVar9 + 1) {
          fVar13 = *(float *)((long)vptr +
                             (CONCAT44(lo[0]._4_4_,(int)lo[0]) * -0x100000000 + lVar12 >> 0x1e));
          __val = (double)CONCAT44(fStack_74,fVar13);
          if (((lVar11 == lVar9) || (fVar13 != 0.0)) || (NAN(fVar13))) {
            lVar6 = lVar11;
            lVar8 = lVar9;
            if (trans == 0) {
              lVar6 = lVar9;
              lVar8 = lVar11;
            }
            pnga_sprs_array_add_element(s_a,lVar6 + -1,lVar8 + -1,&_val);
            lVar8 = hi[0];
          }
          lVar12 = lVar12 + 0x100000000;
        }
      }
      break;
    case 3:
      local_60 = (void *)((ulong)((iVar3 - (int)lo[0]) + 1) << 0x20);
      lVar8 = hi[0];
      for (lVar11 = CONCAT44(lo[1]._4_4_,(int)lo[1]); lVar11 <= hi[1]; lVar11 = lVar11 + 1) {
        lVar9 = CONCAT44(lo[0]._4_4_,(int)lo[0]);
        lVar12 = (lVar9 << 0x20) + (lVar11 - CONCAT44(lo[1]._4_4_,(int)lo[1])) * (long)local_60;
        for (; lVar9 <= lVar8; lVar9 = lVar9 + 1) {
          __val = *(double *)
                   ((long)vptr + (CONCAT44(lo[0]._4_4_,(int)lo[0]) * -0x100000000 + lVar12 >> 0x1d))
          ;
          if (((lVar11 == lVar9) || (__val != 0.0)) || (NAN(__val))) {
            lVar6 = lVar11;
            lVar8 = lVar9;
            if (trans == 0) {
              lVar6 = lVar9;
              lVar8 = lVar11;
            }
            pnga_sprs_array_add_element(s_a,lVar6 + -1,lVar8 + -1,&_val);
            lVar8 = hi[0];
          }
          lVar12 = lVar12 + 0x100000000;
        }
      }
      break;
    default:
switchD_00149f82_caseD_4:
      pnga_error("(ga_sprs_array_create_from_dense) Unknown datatype encountered",(long)iVar10);
      break;
    case 5:
      iVar3 = iVar3 - (int)lo[0];
      lVar8 = hi[0];
      for (lVar11 = CONCAT44(lo[1]._4_4_,(int)lo[1]); lVar11 <= hi[1]; lVar11 = lVar11 + 1) {
        iVar10 = ((int)lVar11 - (int)lo[1]) * (iVar3 * 2 + 2) + (int)lo[0] * 2;
        for (lVar9 = CONCAT44(lo[0]._4_4_,(int)lo[0]); lVar9 <= lVar8; lVar9 = lVar9 + 1) {
          iVar4 = iVar10 + (int)lo[0] * -2;
          fVar13 = *(float *)((long)vptr + (long)iVar4 * 4);
          fVar1 = *(float *)((long)vptr + (long)(iVar4 + 1) * 4);
          __val = (double)CONCAT44(fVar1,fVar13);
          if (((lVar11 == lVar9) || (fVar13 != 0.0)) ||
             ((NAN(fVar13) || ((fVar1 != 0.0 || (NAN(fVar1))))))) {
            lVar12 = lVar11;
            lVar8 = lVar9;
            if (trans == 0) {
              lVar12 = lVar9;
              lVar8 = lVar11;
            }
            pnga_sprs_array_add_element(s_a,lVar12 + -1,lVar8 + -1,&_val);
            lVar8 = hi[0];
          }
          iVar10 = iVar10 + 2;
        }
      }
      break;
    case 6:
      iVar3 = iVar3 - (int)lo[0];
      lVar8 = hi[0];
      for (lVar11 = CONCAT44(lo[1]._4_4_,(int)lo[1]); lVar11 <= hi[1]; lVar11 = lVar11 + 1) {
        iVar10 = ((int)lVar11 - (int)lo[1]) * (iVar3 * 2 + 2) + (int)lo[0] * 2;
        for (lVar9 = CONCAT44(lo[0]._4_4_,(int)lo[0]); lVar9 <= lVar8; lVar9 = lVar9 + 1) {
          iVar4 = iVar10 + (int)lo[0] * -2;
          __val = *(double *)((long)vptr + (long)iVar4 * 8);
          dStack_70 = *(double *)((long)vptr + (long)(iVar4 + 1) * 8);
          if ((((lVar11 == lVar9) || (__val != 0.0)) || (NAN(__val))) ||
             ((dStack_70 != 0.0 || (NAN(dStack_70))))) {
            lVar12 = lVar11;
            lVar8 = lVar9;
            if (trans == 0) {
              lVar12 = lVar9;
              lVar8 = lVar11;
            }
            pnga_sprs_array_add_element(s_a,lVar12 + -1,lVar8 + -1,&_val);
            lVar8 = hi[0];
          }
          iVar10 = iVar10 + 2;
        }
      }
      break;
    case 0xf:
      local_60 = (void *)((ulong)((iVar3 - (int)lo[0]) + 1) << 0x20);
      lVar8 = hi[0];
      for (lVar11 = CONCAT44(lo[1]._4_4_,(int)lo[1]); lVar11 <= hi[1]; lVar11 = lVar11 + 1) {
        lVar9 = CONCAT44(lo[0]._4_4_,(int)lo[0]);
        lVar12 = (lVar9 << 0x20) + (lVar11 - CONCAT44(lo[1]._4_4_,(int)lo[1])) * (long)local_60;
        for (; lVar9 <= lVar8; lVar9 = lVar9 + 1) {
          __val = *(double *)
                   ((long)vptr + (CONCAT44(lo[0]._4_4_,(int)lo[0]) * -0x100000000 + lVar12 >> 0x1d))
          ;
          if ((lVar11 == lVar9) || (__val != 0.0)) {
            lVar6 = lVar11;
            lVar8 = lVar9;
            if (trans == 0) {
              lVar6 = lVar9;
              lVar8 = lVar11;
            }
            pnga_sprs_array_add_element(s_a,lVar6 + -1,lVar8 + -1,&_val);
            lVar8 = hi[0];
          }
          lVar12 = lVar12 + 0x100000000;
        }
      }
    }
  }
  else {
    switch(iVar10 + -0x3e9) {
    case 0:
      lVar9 = hi[0] - CONCAT44(lo[0]._4_4_,(int)lo[0]);
      lVar8 = hi[0];
      for (lVar11 = CONCAT44(lo[1]._4_4_,(int)lo[1]); lVar11 <= hi[1]; lVar11 = lVar11 + 1) {
        lVar6 = CONCAT44(lo[1]._4_4_,(int)lo[1]);
        for (lVar12 = CONCAT44(lo[0]._4_4_,(int)lo[0]); lVar12 <= lVar8; lVar12 = lVar12 + 1) {
          iVar10 = *(int *)((long)vptr +
                           lVar12 * 4 +
                           CONCAT44(lo[0]._4_4_,(int)lo[0]) * -4 +
                           (lVar11 - lVar6) * (lVar9 * 4 + 4));
          __val = (double)CONCAT44(fStack_74,iVar10);
          if ((lVar11 == lVar12) || (iVar10 != 0)) {
            lVar7 = lVar11;
            lVar8 = lVar12;
            if (trans == 0) {
              lVar7 = lVar12;
              lVar8 = lVar11;
            }
            pnga_sprs_array_add_element(s_a,lVar7 + -1,lVar8 + -1,&_val);
            lVar8 = hi[0];
          }
        }
      }
      break;
    case 1:
      lVar9 = hi[0] - CONCAT44(lo[0]._4_4_,(int)lo[0]);
      lVar8 = hi[0];
      for (lVar11 = CONCAT44(lo[1]._4_4_,(int)lo[1]); lVar11 <= hi[1]; lVar11 = lVar11 + 1) {
        lVar6 = CONCAT44(lo[1]._4_4_,(int)lo[1]);
        for (lVar12 = CONCAT44(lo[0]._4_4_,(int)lo[0]); lVar12 <= lVar8; lVar12 = lVar12 + 1) {
          __val = *(double *)
                   ((long)vptr +
                   lVar12 * 8 +
                   CONCAT44(lo[0]._4_4_,(int)lo[0]) * -8 + (lVar11 - lVar6) * (lVar9 * 8 + 8));
          if ((lVar11 == lVar12) || (__val != 0.0)) {
            lVar7 = lVar12;
            lVar8 = lVar11;
            if (trans == 0) {
              lVar7 = lVar11;
              lVar8 = lVar12;
            }
            pnga_sprs_array_add_element(s_a,lVar8 + -1,lVar7 + -1,&_val);
            lVar8 = hi[0];
          }
        }
      }
      break;
    case 2:
      lVar9 = hi[0] - CONCAT44(lo[0]._4_4_,(int)lo[0]);
      lVar8 = hi[0];
      for (lVar11 = CONCAT44(lo[1]._4_4_,(int)lo[1]); lVar11 <= hi[1]; lVar11 = lVar11 + 1) {
        lVar6 = CONCAT44(lo[1]._4_4_,(int)lo[1]);
        for (lVar12 = CONCAT44(lo[0]._4_4_,(int)lo[0]); lVar12 <= lVar8; lVar12 = lVar12 + 1) {
          fVar13 = *(float *)((long)vptr +
                             lVar12 * 4 +
                             CONCAT44(lo[0]._4_4_,(int)lo[0]) * -4 +
                             (lVar11 - lVar6) * (lVar9 * 4 + 4));
          __val = (double)CONCAT44(fStack_74,fVar13);
          if (((lVar11 == lVar12) || (fVar13 != 0.0)) || (NAN(fVar13))) {
            lVar7 = lVar12;
            lVar8 = lVar11;
            if (trans == 0) {
              lVar7 = lVar11;
              lVar8 = lVar12;
            }
            pnga_sprs_array_add_element(s_a,lVar8 + -1,lVar7 + -1,&_val);
            lVar8 = hi[0];
          }
        }
      }
      break;
    case 3:
      lVar9 = hi[0] - CONCAT44(lo[0]._4_4_,(int)lo[0]);
      lVar8 = hi[0];
      for (lVar11 = CONCAT44(lo[1]._4_4_,(int)lo[1]); lVar11 <= hi[1]; lVar11 = lVar11 + 1) {
        lVar6 = CONCAT44(lo[1]._4_4_,(int)lo[1]);
        for (lVar12 = CONCAT44(lo[0]._4_4_,(int)lo[0]); lVar12 <= lVar8; lVar12 = lVar12 + 1) {
          __val = *(double *)
                   ((long)vptr +
                   lVar12 * 8 +
                   CONCAT44(lo[0]._4_4_,(int)lo[0]) * -8 + (lVar11 - lVar6) * (lVar9 * 8 + 8));
          if (((lVar11 == lVar12) || (__val != 0.0)) || (NAN(__val))) {
            lVar7 = lVar12;
            lVar8 = lVar11;
            if (trans == 0) {
              lVar7 = lVar11;
              lVar8 = lVar12;
            }
            pnga_sprs_array_add_element(s_a,lVar8 + -1,lVar7 + -1,&_val);
            lVar8 = hi[0];
          }
        }
      }
      break;
    default:
      goto switchD_00149f82_caseD_4;
    case 5:
      lVar9 = hi[0] - CONCAT44(lo[0]._4_4_,(int)lo[0]);
      lVar8 = hi[0];
      for (lVar11 = CONCAT44(lo[1]._4_4_,(int)lo[1]); lVar11 <= hi[1]; lVar11 = lVar11 + 1) {
        lVar6 = CONCAT44(lo[1]._4_4_,(int)lo[1]);
        for (lVar12 = CONCAT44(lo[0]._4_4_,(int)lo[0]); lVar12 <= lVar8; lVar12 = lVar12 + 1) {
          __val = *(double *)
                   ((long)vptr +
                   lVar12 * 8 +
                   CONCAT44(lo[0]._4_4_,(int)lo[0]) * -8 + (lVar11 - lVar6) * (lVar9 * 8 + 8));
          fVar13 = (float)((ulong)__val >> 0x20);
          if (((lVar11 == lVar12) || (SUB84(__val,0) != 0.0)) ||
             ((NAN(SUB84(__val,0)) || ((fVar13 != 0.0 || (NAN(fVar13))))))) {
            lVar7 = lVar12;
            lVar8 = lVar11;
            if (trans == 0) {
              lVar7 = lVar11;
              lVar8 = lVar12;
            }
            pnga_sprs_array_add_element(s_a,lVar8 + -1,lVar7 + -1,&_val);
            lVar8 = hi[0];
          }
        }
      }
      break;
    case 6:
      local_60 = vptr;
      local_58 = (hi[0] - CONCAT44(lo[0]._4_4_,(int)lo[0])) * 0x10 + 0x10;
      lVar8 = hi[0];
      for (lVar11 = CONCAT44(lo[1]._4_4_,(int)lo[1]); lVar11 <= hi[1]; lVar11 = lVar11 + 1) {
        lVar9 = CONCAT44(lo[0]._4_4_,(int)lo[0]);
        lVar12 = (long)local_60 +
                 (lVar11 - CONCAT44(lo[1]._4_4_,(int)lo[1])) * local_58 + lVar9 * 0x10;
        for (; lVar9 <= lVar8; lVar9 = lVar9 + 1) {
          pdVar5 = (double *)(lVar12 + CONCAT44(lo[0]._4_4_,(int)lo[0]) * -0x10);
          __val = *pdVar5;
          dStack_70 = pdVar5[1];
          if ((((lVar11 == lVar9) || (__val != 0.0)) || (NAN(__val))) ||
             ((dStack_70 != 0.0 || (NAN(dStack_70))))) {
            lVar6 = lVar9;
            lVar8 = lVar11;
            if (trans == 0) {
              lVar6 = lVar11;
              lVar8 = lVar9;
            }
            pnga_sprs_array_add_element(s_a,lVar8 + -1,lVar6 + -1,&_val);
            lVar8 = hi[0];
          }
          lVar12 = lVar12 + 0x10;
        }
      }
      break;
    case 0xf:
      lVar9 = hi[0] - CONCAT44(lo[0]._4_4_,(int)lo[0]);
      lVar8 = hi[0];
      for (lVar11 = CONCAT44(lo[1]._4_4_,(int)lo[1]); lVar11 <= hi[1]; lVar11 = lVar11 + 1) {
        lVar6 = CONCAT44(lo[1]._4_4_,(int)lo[1]);
        for (lVar12 = CONCAT44(lo[0]._4_4_,(int)lo[0]); lVar12 <= lVar8; lVar12 = lVar12 + 1) {
          __val = *(double *)
                   ((long)vptr +
                   lVar12 * 8 +
                   CONCAT44(lo[0]._4_4_,(int)lo[0]) * -8 + (lVar11 - lVar6) * (lVar9 * 8 + 8));
          if ((lVar11 == lVar12) || (__val != 0.0)) {
            lVar7 = lVar12;
            lVar8 = lVar11;
            if (trans == 0) {
              lVar7 = lVar11;
              lVar8 = lVar12;
            }
            pnga_sprs_array_add_element(s_a,lVar8 + -1,lVar7 + -1,&_val);
            lVar8 = hi[0];
          }
        }
      }
    }
  }
  lVar11 = local_48;
  pnga_mask_sync(local_50,local_48);
  lVar2 = pnga_sprs_array_assemble(s_a);
  lVar8 = local_40;
  if (lVar2 == 0) {
    pnga_error("(ga_sprs_array_create_from_dense) failed to create sparse array from dense array",0)
    ;
  }
  if ((int)lVar11 != 0) {
    pnga_pgroup_sync(lVar8);
  }
  return s_a;
}

Assistant:

Integer pnga_sprs_array_create_from_dense(Integer g_a, Integer idx_size,
    Integer trans)
{
  Integer handle = g_a + GA_OFFSET, s_a;
  int local_sync_begin,local_sync_end;
  Integer i, j, idx, jdx, lo[2], hi[2], ld;
  Integer idim, jdim;
  int grp = GA[handle].p_handle;
  int me = (int)pnga_pgroup_nodeid(grp);
  void *vptr;
  int type = GA[handle].type;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(grp);

  /* Check dimension */
  if (GA[handle].ndim != 2) {
    pnga_error("(ga_sprs_array_create_from_dense) global array"
        " must be of dimension 2",0);
  }
  if (trans) {
    idim = (Integer)GA[handle].dims[1];
    jdim = (Integer)GA[handle].dims[0];
  } else {
    idim = (Integer)GA[handle].dims[0];
    jdim = (Integer)GA[handle].dims[1];
  }

  /* create sparse array */
  s_a = pnga_sprs_array_create(idim, jdim, type, idx_size);
  /* find bounding indices of locally owned block from global array */
  pnga_distribution(g_a,me,lo,hi);
  /* get pointer to locally owned block */
  pnga_access_ptr(g_a, lo, hi, &vptr, &ld);
  /* add all non-zero entries from g_a to s_a. Add diagonal elements
   * to s_a even if they are zero */
  if (idx_size == 4) {
    if (type == C_INT) {
      SPRS_REAL_FILTER_M(int,int,vptr);
    } else if (type == C_LONG) {
      SPRS_REAL_FILTER_M(long,int,vptr);
    } else if (type == C_LONGLONG) {
      SPRS_REAL_FILTER_M(long long,int,vptr);
    } else if (type == C_FLOAT) {
      SPRS_REAL_FILTER_M(float,int,vptr);
    } else if (type == C_DBL) {
      SPRS_REAL_FILTER_M(double,int,vptr);
    } else if (type == C_SCPL) {
      SPRS_COMPLEX_FILTER_M(float,int,vptr);
    } else if (type == C_DCPL) {
      SPRS_COMPLEX_FILTER_M(double,int,vptr);
    } else {
      pnga_error("(ga_sprs_array_create_from_dense) Unknown datatype"
          " encountered",type);
    }
  } else {
    if (type == C_INT) {
      SPRS_REAL_FILTER_M(int,int64_t,vptr);
    } else if (type == C_LONG) {
      SPRS_REAL_FILTER_M(long,int64_t,vptr);
    } else if (type == C_LONGLONG) {
      SPRS_REAL_FILTER_M(long long,int64_t,vptr);
    } else if (type == C_FLOAT) {
      SPRS_REAL_FILTER_M(float,int64_t,vptr);
    } else if (type == C_DBL) {
      SPRS_REAL_FILTER_M(double,int64_t,vptr);
    } else if (type == C_SCPL) {
      SPRS_COMPLEX_FILTER_M(float,int64_t,vptr);
    } else if (type == C_DCPL) {
      SPRS_COMPLEX_FILTER_M(double,int64_t,vptr);
    } else {
      pnga_error("(ga_sprs_array_create_from_dense) Unknown datatype"
          " encountered",type);
    }
  }
  pnga_mask_sync(local_sync_begin,local_sync_end);
  if (!pnga_sprs_array_assemble(s_a)) {
    pnga_error("(ga_sprs_array_create_from_dense) failed to create"
        " sparse array from dense array",0);
  }
  if (local_sync_end) pnga_pgroup_sync(grp);
  return s_a;
}